

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void unquote(string *v)

{
  string local_38 [32];
  
  std::__cxx11::string::substr((ulong)local_38,(ulong)v);
  std::__cxx11::string::operator=((string *)v,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void unquote(std::string& v)
{
    v = v.substr(1, v.length() - 2);
}